

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

fdb_status docio_read_doc_length(docio_handle *handle,docio_length *length,uint64_t offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  docio_length length_00;
  undefined8 in_RDX;
  ushort *in_RSI;
  undefined8 *in_RDI;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  byte bVar20;
  docio_length dVar21;
  err_log_callback *log_callback;
  docio_length zero_length;
  docio_length _length;
  int64_t _offset;
  uint8_t checksum;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 uVar22;
  undefined8 local_a8;
  err_log_callback *in_stack_ffffffffffffff68;
  docio_length *in_stack_ffffffffffffff70;
  err_log_callback *log_callback_00;
  char in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff81;
  char in_stack_ffffffffffffff82;
  char in_stack_ffffffffffffff83;
  char in_stack_ffffffffffffff84;
  char in_stack_ffffffffffffff85;
  char in_stack_ffffffffffffff86;
  char in_stack_ffffffffffffff87;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  uint8_t uStack_74;
  byte bStack_73;
  char cStack_72;
  char cStack_71;
  docio_length local_70;
  int64_t local_60;
  byte local_51;
  undefined8 local_50;
  ushort *local_48;
  undefined8 *local_40;
  fdb_status local_34;
  
  uVar22 = (undefined4)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  docio_length::docio_length(&local_70);
  docio_length::docio_length((docio_length *)&stack0xffffffffffffff80);
  log_callback_00 = (err_log_callback *)local_40[6];
  local_60 = _docio_read_length((docio_handle *)
                                CONCAT17(in_stack_ffffffffffffff87,
                                         CONCAT16(in_stack_ffffffffffffff86,
                                                  CONCAT15(in_stack_ffffffffffffff85,
                                                           CONCAT14(in_stack_ffffffffffffff84,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff83,
                                                  CONCAT12(in_stack_ffffffffffffff82,
                                                           CONCAT11(in_stack_ffffffffffffff81,
                                                                    in_stack_ffffffffffffff80)))))))
                                ,(uint64_t)log_callback_00,in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68,local_a8._15_1_);
  if (local_60 < 0) {
    local_34 = (fdb_status)local_60;
  }
  else {
    memset(&stack0xffffffffffffff80,0,0x10);
    cVar7 = -((char)local_70.metalen == in_stack_ffffffffffffff82);
    cVar8 = -(local_70.metalen._1_1_ == in_stack_ffffffffffffff83);
    cVar9 = -((char)local_70.bodylen == in_stack_ffffffffffffff84);
    cVar10 = -(local_70.bodylen._1_1_ == in_stack_ffffffffffffff85);
    cVar11 = -(local_70.bodylen._2_1_ == in_stack_ffffffffffffff86);
    cVar12 = -(local_70.bodylen._3_1_ == in_stack_ffffffffffffff87);
    cVar13 = -((char)local_70.bodylen_ondisk == cStack_78);
    cVar14 = -(local_70.bodylen_ondisk._1_1_ == cStack_77);
    cVar15 = -(local_70.bodylen_ondisk._2_1_ == cStack_76);
    cVar16 = -(local_70.bodylen_ondisk._3_1_ == cStack_75);
    cVar17 = -(local_70.flag == uStack_74);
    cVar18 = -(local_70.checksum == bStack_73);
    cVar19 = -((char)local_70.reserved == cStack_72);
    bVar20 = -(local_70.reserved._1_1_ == cStack_71);
    auVar1[1] = -(local_70.keylen._1_1_ == in_stack_ffffffffffffff81);
    auVar1[0] = -((char)local_70.keylen == in_stack_ffffffffffffff80);
    auVar1[2] = cVar7;
    auVar1[3] = cVar8;
    auVar1[4] = cVar9;
    auVar1[5] = cVar10;
    auVar1[6] = cVar11;
    auVar1[7] = cVar12;
    auVar1[8] = cVar13;
    auVar1[9] = cVar14;
    auVar1[10] = cVar15;
    auVar1[0xb] = cVar16;
    auVar1[0xc] = cVar17;
    auVar1[0xd] = cVar18;
    auVar1[0xe] = cVar19;
    auVar1[0xf] = bVar20;
    auVar2[1] = -(local_70.keylen._1_1_ == in_stack_ffffffffffffff81);
    auVar2[0] = -((char)local_70.keylen == in_stack_ffffffffffffff80);
    auVar2[2] = cVar7;
    auVar2[3] = cVar8;
    auVar2[4] = cVar9;
    auVar2[5] = cVar10;
    auVar2[6] = cVar11;
    auVar2[7] = cVar12;
    auVar2[8] = cVar13;
    auVar2[9] = cVar14;
    auVar2[10] = cVar15;
    auVar2[0xb] = cVar16;
    auVar2[0xc] = cVar17;
    auVar2[0xd] = cVar18;
    auVar2[0xe] = cVar19;
    auVar2[0xf] = bVar20;
    auVar6[1] = cVar8;
    auVar6[0] = cVar7;
    auVar6[2] = cVar9;
    auVar6[3] = cVar10;
    auVar6[4] = cVar11;
    auVar6[5] = cVar12;
    auVar6[6] = cVar13;
    auVar6[7] = cVar14;
    auVar6[8] = cVar15;
    auVar6[9] = cVar16;
    auVar6[10] = cVar17;
    auVar6[0xb] = cVar18;
    auVar6[0xc] = cVar19;
    auVar6[0xd] = bVar20;
    auVar5[1] = cVar9;
    auVar5[0] = cVar8;
    auVar5[2] = cVar10;
    auVar5[3] = cVar11;
    auVar5[4] = cVar12;
    auVar5[5] = cVar13;
    auVar5[6] = cVar14;
    auVar5[7] = cVar15;
    auVar5[8] = cVar16;
    auVar5[9] = cVar17;
    auVar5[10] = cVar18;
    auVar5[0xb] = cVar19;
    auVar5[0xc] = bVar20;
    auVar4[1] = cVar10;
    auVar4[0] = cVar9;
    auVar4[2] = cVar11;
    auVar4[3] = cVar12;
    auVar4[4] = cVar13;
    auVar4[5] = cVar14;
    auVar4[6] = cVar15;
    auVar4[7] = cVar16;
    auVar4[8] = cVar17;
    auVar4[9] = cVar18;
    auVar4[10] = cVar19;
    auVar4[0xb] = bVar20;
    auVar3[1] = cVar11;
    auVar3[0] = cVar10;
    auVar3[2] = cVar12;
    auVar3[3] = cVar13;
    auVar3[4] = cVar14;
    auVar3[5] = cVar15;
    auVar3[6] = cVar16;
    auVar3[7] = cVar17;
    auVar3[8] = cVar18;
    auVar3[9] = cVar19;
    auVar3[10] = bVar20;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar20,CONCAT18(cVar19,CONCAT17(cVar18,CONCAT16(cVar17,
                                                  CONCAT15(cVar16,CONCAT14(cVar15,CONCAT13(cVar14,
                                                  CONCAT12(cVar13,CONCAT11(cVar12,cVar11))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar20,CONCAT17(cVar19,CONCAT16(cVar18,CONCAT15(cVar17,
                                                  CONCAT14(cVar16,CONCAT13(cVar15,CONCAT12(cVar14,
                                                  CONCAT11(cVar13,cVar12)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar20 >> 7) << 0xf) == 0xffff) {
      *(ulong *)local_48 =
           CONCAT17(in_stack_ffffffffffffff87,
                    CONCAT16(in_stack_ffffffffffffff86,
                             CONCAT15(in_stack_ffffffffffffff85,
                                      CONCAT14(in_stack_ffffffffffffff84,
                                               CONCAT13(in_stack_ffffffffffffff83,
                                                        CONCAT12(in_stack_ffffffffffffff82,
                                                                 CONCAT11(in_stack_ffffffffffffff81,
                                                                          in_stack_ffffffffffffff80)
                                                                ))))));
      *(ulong *)(local_48 + 4) =
           CONCAT17(cStack_71,
                    CONCAT16(cStack_72,
                             CONCAT15(bStack_73,
                                      CONCAT14(uStack_74,
                                               CONCAT13(cStack_75,
                                                        CONCAT12(cStack_76,
                                                                 CONCAT11(cStack_77,cStack_78)))))))
      ;
      local_34 = FDB_RESULT_SUCCESS;
    }
    else {
      dVar21.bodylen_ondisk = (int)in_stack_ffffffffffffff00;
      dVar21.flag = (char)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      dVar21.checksum = (char)((ulong)in_stack_ffffffffffffff00 >> 0x28);
      dVar21.reserved = (short)((ulong)in_stack_ffffffffffffff00 >> 0x30);
      dVar21.keylen = (short)in_stack_fffffffffffffef8;
      dVar21.metalen = (short)((ulong)in_stack_fffffffffffffef8 >> 0x10);
      dVar21.bodylen = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
      local_51 = _docio_length_checksum(dVar21,(docio_handle *)0x132305);
      if (local_51 == local_70.checksum) {
        length_00.bodylen_ondisk = (int)in_stack_fffffffffffffef8;
        length_00.flag = (char)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        length_00.checksum = (char)((ulong)in_stack_fffffffffffffef8 >> 0x28);
        length_00.reserved = (short)((ulong)in_stack_fffffffffffffef8 >> 0x30);
        length_00.keylen = 0x2403;
        length_00.metalen = 0x13;
        length_00.bodylen = 0;
        dVar21 = _docio_length_decode(length_00);
        local_a8 = dVar21._0_8_;
        *(undefined8 *)local_48 = local_a8;
        *(long *)(local_48 + 4) = dVar21._8_8_;
        if ((*local_48 == 0) || (0xfff0 < *local_48)) {
          fdb_log_impl(log_callback_00,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc_length",0x3f8,
                       "Error in decoding the doc length metadata in file %s crc %x keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                       ,*(undefined8 *)*local_40,(uint)local_51,
                       (uint)CONCAT11(local_70.keylen._1_1_,(char)local_70.keylen),
                       (uint)CONCAT11(local_70.metalen._1_1_,(char)local_70.metalen),
                       CONCAT13(local_70.bodylen._3_1_,
                                CONCAT12(local_70.bodylen._2_1_,
                                         CONCAT11(local_70.bodylen._1_1_,(char)local_70.bodylen))),
                       CONCAT13(local_70.bodylen_ondisk._3_1_,
                                CONCAT12(local_70.bodylen_ondisk._2_1_,
                                         CONCAT11(local_70.bodylen_ondisk._1_1_,
                                                  (char)local_70.bodylen_ondisk))),local_50);
          local_34 = FDB_RESULT_FILE_CORRUPTION;
        }
        else {
          local_34 = FDB_RESULT_SUCCESS;
        }
      }
      else {
        fdb_log_impl(log_callback_00,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_length",0x3ed,
                     "doc_length checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,*(undefined8 *)*local_40,(uint)local_51,(uint)local_70.checksum,
                     (uint)CONCAT11(local_70.keylen._1_1_,(char)local_70.keylen),
                     (uint)CONCAT11(local_70.metalen._1_1_,(char)local_70.metalen),
                     CONCAT13(local_70.bodylen._3_1_,
                              CONCAT12(local_70.bodylen._2_1_,
                                       CONCAT11(local_70.bodylen._1_1_,(char)local_70.bodylen))),
                     CONCAT44(uVar22,CONCAT13(local_70.bodylen_ondisk._3_1_,
                                              CONCAT12(local_70.bodylen_ondisk._2_1_,
                                                       CONCAT11(local_70.bodylen_ondisk._1_1_,
                                                                (char)local_70.bodylen_ondisk)))),
                     local_50);
        local_34 = FDB_RESULT_CHECKSUM_ERROR;
      }
    }
  }
  return local_34;
}

Assistant:

fdb_status docio_read_doc_length(struct docio_handle *handle,
                                 struct docio_length *length,
                                 uint64_t offset)
{
    uint8_t checksum;
    int64_t _offset;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback, true);
    if (_offset < 0) {
        return (fdb_status) _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        *length = zero_length;
        return FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_CHECKSUM_ERROR;
    }

    *length = _docio_length_decode(_length);
    if (length->keylen == 0 || length->keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata in file %s"
                " crc %x keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_FILE_CORRUPTION;
    }

    return FDB_RESULT_SUCCESS;
}